

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_75(QPDF *pdf,char *arg2)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long *plVar5;
  long lVar6;
  undefined1 in_R8B;
  QPDFObjectHandle QVar7;
  QPDFObjectHandle QVar8;
  QPDFObjectHandle QVar9;
  QPDFObjectHandle QVar10;
  QPDFNumberTreeObjectHelper erase3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_238 [6];
  allocator<char> local_201;
  QPDFNumberTreeObjectHelper erase4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1f8 [6];
  QPDFWriter w;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1c0 [5];
  QPDFObjectHandle k1;
  QPDFObjectHandle l1;
  QPDFNumberTreeObjectHelper erase2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_170 [8];
  allocator<char> local_130 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_128;
  QPDFObjectHandle erase2_oh;
  iterator iter1;
  iterator iter2;
  QPDFObjectHandle value;
  string local_88 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  string local_78 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  string local_68 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_58;
  QPDFNameTreeObjectHelper erase1;
  
  QPDF::getTrailer();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&iter1,"/Erase1",(allocator<char> *)&erase3);
  QPDFObjectHandle::getKey(local_68);
  QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
  QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_68;
  QPDFNameTreeObjectHelper::QPDFNameTreeObjectHelper(&erase1,QVar7,(QPDF *)0x1,(bool)in_R8B);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
  std::__cxx11::string::~string((string *)&iter1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_170);
  value.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  value.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&iter1,"1X",(allocator<char> *)&erase2);
  cVar1 = QPDFNameTreeObjectHelper::remove((string *)&erase1,(QPDFObjectHandle *)&iter1);
  if (cVar1 != '\0') {
    __assert_fail("!erase1.remove(\"1X\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa0c,"void test_75(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&iter1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&iter1,"1C",(allocator<char> *)&erase2);
  cVar1 = QPDFNameTreeObjectHelper::remove((string *)&erase1,(QPDFObjectHandle *)&iter1);
  if (cVar1 == '\0') {
    __assert_fail("erase1.remove(\"1C\", &value)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa0d,"void test_75(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&iter1);
  QPDFObjectHandle::getUTF8Value_abi_cxx11_();
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &iter1,"c");
  if (!bVar2) {
    __assert_fail("value.getUTF8Value() == \"c\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa0e,"void test_75(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&iter1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&erase2,"1B",(allocator<char> *)&erase3);
  QPDFNameTreeObjectHelper::find((string *)&iter1,SUB81(&erase1,0));
  std::__cxx11::string::~string((string *)&erase2);
  QPDFNameTreeObjectHelper::iterator::remove();
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
  bVar2 = std::operator==(pbVar4,"1D");
  if (!bVar2) {
    __assert_fail("iter1->first == \"1D\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa11,"void test_75(QPDF &, const char *)");
  }
  QPDFNameTreeObjectHelper::iterator::remove();
  QPDFNameTreeObjectHelper::end();
  cVar1 = QPDFNameTreeObjectHelper::iterator::operator==(&iter1,(iterator *)&erase2);
  if (cVar1 == '\0') {
    __assert_fail("iter1 == erase1.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa13,"void test_75(QPDF &, const char *)");
  }
  QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)&erase2);
  QPDFNameTreeObjectHelper::iterator::operator--(&iter1);
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
  bVar2 = std::operator==(pbVar4,"1A");
  if (!bVar2) {
    __assert_fail("iter1->first == \"1A\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa15,"void test_75(QPDF &, const char *)");
  }
  QPDFNameTreeObjectHelper::iterator::remove();
  QPDFNameTreeObjectHelper::end();
  cVar1 = QPDFNameTreeObjectHelper::iterator::operator==(&iter1,(iterator *)&erase2);
  if (cVar1 == '\0') {
    __assert_fail("iter1 == erase1.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa17,"void test_75(QPDF &, const char *)");
  }
  QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)&erase2);
  QPDF::getTrailer();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&erase2,"/Erase2",(allocator<char> *)&erase4);
  QPDFObjectHandle::getKey((string *)&erase2_oh);
  std::__cxx11::string::~string((string *)&erase2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_238);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_58,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&erase2_oh);
  QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
  QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_58;
  QPDFNumberTreeObjectHelper::QPDFNumberTreeObjectHelper(&erase2,QVar8,(QPDF *)0x1,(bool)in_R8B);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  QPDFNumberTreeObjectHelper::find((longlong)&iter2,SUB81(&erase2,0));
  QPDFNumberTreeObjectHelper::iterator::remove();
  QPDFNumberTreeObjectHelper::end();
  cVar1 = QPDFNumberTreeObjectHelper::iterator::operator==(&iter2,(iterator *)&erase3);
  if (cVar1 == '\0') {
    __assert_fail("iter2 == erase2.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa1d,"void test_75(QPDF &, const char *)");
  }
  QPDFNumberTreeObjectHelper::iterator::~iterator((iterator *)&erase3);
  QPDFNumberTreeObjectHelper::iterator::operator--(&iter2);
  plVar5 = (long *)QPDFNumberTreeObjectHelper::iterator::operator->(&iter2);
  if (*plVar5 != 0xf0) {
    __assert_fail("iter2->first == 240",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa1f,"void test_75(QPDF &, const char *)");
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&erase3,"/Kids",(allocator<char> *)&w);
  QPDFObjectHandle::getKey((string *)&erase4);
  QPDFObjectHandle::getArrayItem((int)&k1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_1f8);
  std::__cxx11::string::~string((string *)&erase3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&erase3,"/Limits",(allocator<char> *)&erase4);
  QPDFObjectHandle::getKey((string *)&l1);
  std::__cxx11::string::~string((string *)&erase3);
  QPDFObjectHandle::getArrayItem((int)&erase3);
  lVar6 = QPDFObjectHandle::getIntValue();
  if (lVar6 != 0xe6) {
    __assert_fail("l1.getArrayItem(0).getIntValue() == 230",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa22,"void test_75(QPDF &, const char *)");
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_238);
  QPDFObjectHandle::getArrayItem((int)&erase3);
  lVar6 = QPDFObjectHandle::getIntValue();
  if (lVar6 != 0xf0) {
    __assert_fail("l1.getArrayItem(1).getIntValue() == 240",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa23,"void test_75(QPDF &, const char *)");
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_238);
  QPDFNumberTreeObjectHelper::find((longlong)&erase3,SUB81(&erase2,0));
  QPDFNumberTreeObjectHelper::iterator::operator=(&iter2,(iterator *)&erase3);
  QPDFNumberTreeObjectHelper::iterator::~iterator((iterator *)&erase3);
  QPDFNumberTreeObjectHelper::iterator::remove();
  plVar5 = (long *)QPDFNumberTreeObjectHelper::iterator::operator->(&iter2);
  if (*plVar5 != 0xdc) {
    __assert_fail("iter2->first == 220",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa26,"void test_75(QPDF &, const char *)");
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&erase3,"/Kids",local_130);
  QPDFObjectHandle::getKey((string *)&w);
  QPDFObjectHandle::getArrayItem((int)&erase4);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&k1,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&erase4);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_1f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_1c0);
  std::__cxx11::string::~string((string *)&erase3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&erase3,"/Limits",(allocator<char> *)&w);
  QPDFObjectHandle::getKey((string *)&erase4);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&l1,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&erase4);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_1f8);
  std::__cxx11::string::~string((string *)&erase3);
  QPDFObjectHandle::getArrayItem((int)&erase3);
  lVar6 = QPDFObjectHandle::getIntValue();
  if (lVar6 != 0xdc) {
    __assert_fail("l1.getArrayItem(0).getIntValue() == 220",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa29,"void test_75(QPDF &, const char *)");
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_238);
  QPDFObjectHandle::getArrayItem((int)&erase3);
  lVar6 = QPDFObjectHandle::getIntValue();
  if (lVar6 != 0xdc) {
    __assert_fail("l1.getArrayItem(1).getIntValue() == 220",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa2a,"void test_75(QPDF &, const char *)");
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&erase3,"/Kids",(allocator<char> *)&w);
  QPDFObjectHandle::getKey((string *)&erase4);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&k1,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&erase4);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_1f8);
  std::__cxx11::string::~string((string *)&erase3);
  iVar3 = QPDFObjectHandle::getArrayNItems();
  if (iVar3 != 1) {
    __assert_fail("k1.getArrayNItems() == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa2c,"void test_75(QPDF &, const char *)");
  }
  QPDF::getTrailer();
  std::__cxx11::string::string<std::allocator<char>>((string *)&erase4,"/Erase3",local_130);
  QPDFObjectHandle::getKey(local_78);
  QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
  QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_78;
  QPDFNumberTreeObjectHelper::QPDFNumberTreeObjectHelper(&erase3,QVar9,(QPDF *)0x1,(bool)in_R8B);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
  std::__cxx11::string::~string((string *)&erase4);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_1c0);
  QPDFNumberTreeObjectHelper::find((longlong)&erase4,SUB81(&erase3,0));
  QPDFNumberTreeObjectHelper::iterator::operator=(&iter2,(iterator *)&erase4);
  QPDFNumberTreeObjectHelper::iterator::~iterator((iterator *)&erase4);
  QPDFNumberTreeObjectHelper::iterator::remove();
  QPDFNumberTreeObjectHelper::end();
  cVar1 = QPDFNumberTreeObjectHelper::iterator::operator==(&iter2,(iterator *)&erase4);
  if (cVar1 != '\0') {
    QPDFNumberTreeObjectHelper::iterator::~iterator((iterator *)&erase4);
    QPDFNumberTreeObjectHelper::remove((longlong)&erase3,(QPDFObjectHandle *)0x136);
    QPDFNumberTreeObjectHelper::begin();
    QPDFNumberTreeObjectHelper::end();
    cVar1 = QPDFNumberTreeObjectHelper::iterator::operator==((iterator *)&erase4,(iterator *)&w);
    if (cVar1 == '\0') {
      __assert_fail("erase3.begin() == erase3.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                    ,0xa33,"void test_75(QPDF &, const char *)");
    }
    QPDFNumberTreeObjectHelper::iterator::~iterator((iterator *)&w);
    QPDFNumberTreeObjectHelper::iterator::~iterator((iterator *)&erase4);
    QPDF::getTrailer();
    std::__cxx11::string::string<std::allocator<char>>((string *)&w,"/Erase4",&local_201);
    QPDFObjectHandle::getKey(local_88);
    QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
    QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_88;
    QPDFNumberTreeObjectHelper::QPDFNumberTreeObjectHelper(&erase4,QVar10,(QPDF *)0x1,(bool)in_R8B);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80);
    std::__cxx11::string::~string((string *)&w);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_128);
    QPDFNumberTreeObjectHelper::find((longlong)&w,false);
    QPDFNumberTreeObjectHelper::iterator::operator=(&iter2,(iterator *)&w);
    QPDFNumberTreeObjectHelper::iterator::~iterator((iterator *)&w);
    QPDFNumberTreeObjectHelper::iterator::remove();
    plVar5 = (long *)QPDFNumberTreeObjectHelper::iterator::operator->(&iter2);
    if (*plVar5 == 0x1ae) {
      QPDFWriter::QPDFWriter(&w,pdf,"a.pdf");
      QPDFWriter::setStaticID(SUB81(&w,0));
      QPDFWriter::setQDFMode(SUB81(&w,0));
      QPDFWriter::write();
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_1c0);
      QPDFNumberTreeObjectHelper::~QPDFNumberTreeObjectHelper(&erase4);
      QPDFNumberTreeObjectHelper::~QPDFNumberTreeObjectHelper(&erase3);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&l1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&k1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      QPDFNumberTreeObjectHelper::iterator::~iterator(&iter2);
      QPDFNumberTreeObjectHelper::~QPDFNumberTreeObjectHelper(&erase2);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&erase2_oh.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      QPDFNameTreeObjectHelper::iterator::~iterator(&iter1);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&value.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper(&erase1);
      return;
    }
    __assert_fail("iter2->first == 430",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xa38,"void test_75(QPDF &, const char *)");
  }
  __assert_fail("iter2 == erase3.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                ,0xa31,"void test_75(QPDF &, const char *)");
}

Assistant:

static void
test_75(QPDF& pdf, char const* arg2)
{
    // This test is crafted to work with erase-nntree.pdf
    auto erase1 = QPDFNameTreeObjectHelper(pdf.getTrailer().getKey("/Erase1"), pdf);
    QPDFObjectHandle value;
    assert(!erase1.remove("1X"));
    assert(erase1.remove("1C", &value));
    assert(value.getUTF8Value() == "c");
    auto iter1 = erase1.find("1B");
    iter1.remove();
    assert(iter1->first == "1D");
    iter1.remove();
    assert(iter1 == erase1.end());
    --iter1;
    assert(iter1->first == "1A");
    iter1.remove();
    assert(iter1 == erase1.end());

    auto erase2_oh = pdf.getTrailer().getKey("/Erase2");
    auto erase2 = QPDFNumberTreeObjectHelper(erase2_oh, pdf);
    auto iter2 = erase2.find(250);
    iter2.remove();
    assert(iter2 == erase2.end());
    --iter2;
    assert(iter2->first == 240);
    auto k1 = erase2_oh.getKey("/Kids").getArrayItem(1);
    auto l1 = k1.getKey("/Limits");
    assert(l1.getArrayItem(0).getIntValue() == 230);
    assert(l1.getArrayItem(1).getIntValue() == 240);
    iter2 = erase2.find(210);
    iter2.remove();
    assert(iter2->first == 220);
    k1 = erase2_oh.getKey("/Kids").getArrayItem(0);
    l1 = k1.getKey("/Limits");
    assert(l1.getArrayItem(0).getIntValue() == 220);
    assert(l1.getArrayItem(1).getIntValue() == 220);
    k1 = k1.getKey("/Kids");
    assert(k1.getArrayNItems() == 1);

    auto erase3 = QPDFNumberTreeObjectHelper(pdf.getTrailer().getKey("/Erase3"), pdf);
    iter2 = erase3.find(320);
    iter2.remove();
    assert(iter2 == erase3.end());
    erase3.remove(310);
    assert(erase3.begin() == erase3.end());

    auto erase4 = QPDFNumberTreeObjectHelper(pdf.getTrailer().getKey("/Erase4"), pdf);
    iter2 = erase4.find(420);
    iter2.remove();
    assert(iter2->first == 430);

    QPDFWriter w(pdf, "a.pdf");
    w.setStaticID(true);
    w.setQDFMode(true);
    w.write();
}